

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void FTransformWHT_SSE2(int16_t *in,int16_t *out)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  undefined1 auVar3 [12];
  undefined1 auVar6 [16];
  
  FTransformWHTRow_SSE2(in,(__m128i *)&local_48);
  FTransformWHTRow_SSE2(in + 0x40,(__m128i *)&local_58);
  FTransformWHTRow_SSE2(in + 0x80,(__m128i *)&local_68);
  FTransformWHTRow_SSE2(in + 0xc0,(__m128i *)&local_78);
  auVar4._0_4_ = local_68 + local_48;
  auVar4._4_4_ = iStack_64 + iStack_44;
  auVar4._8_4_ = iStack_60 + iStack_40;
  auVar4._12_4_ = iStack_5c + iStack_3c;
  auVar8._0_4_ = local_78 + local_58;
  auVar8._4_4_ = iStack_74 + iStack_54;
  auVar8._8_4_ = iStack_70 + iStack_50;
  auVar8._12_4_ = iStack_6c + iStack_4c;
  auVar7._0_4_ = local_58 - local_78;
  auVar7._4_4_ = iStack_54 - iStack_74;
  auVar7._8_4_ = iStack_50 - iStack_70;
  auVar7._12_4_ = iStack_4c - iStack_6c;
  auVar9 = packssdw(auVar8,auVar7);
  auVar5._0_4_ = local_48 - local_68;
  auVar5._4_4_ = iStack_44 - iStack_64;
  auVar5._8_4_ = iStack_40 - iStack_60;
  auVar5._12_4_ = iStack_3c - iStack_5c;
  auVar5 = packssdw(auVar4,auVar5);
  auVar1._0_2_ = auVar9._0_2_ + auVar5._0_2_;
  auVar1._2_2_ = auVar9._2_2_ + auVar5._2_2_;
  auVar1._4_2_ = auVar9._4_2_ + auVar5._4_2_;
  auVar1._6_2_ = auVar9._6_2_ + auVar5._6_2_;
  auVar1._8_2_ = auVar9._8_2_ + auVar5._8_2_;
  auVar1._10_2_ = auVar9._10_2_ + auVar5._10_2_;
  auVar1._12_2_ = auVar9._12_2_ + auVar5._12_2_;
  auVar1._14_2_ = auVar9._14_2_ + auVar5._14_2_;
  uVar2 = CONCAT22(auVar5._2_2_ - auVar9._2_2_,auVar5._0_2_ - auVar9._0_2_);
  auVar3._0_8_ = CONCAT26(auVar5._6_2_ - auVar9._6_2_,CONCAT24(auVar5._4_2_ - auVar9._4_2_,uVar2));
  auVar3._8_2_ = auVar5._8_2_ - auVar9._8_2_;
  auVar3._10_2_ = auVar5._10_2_ - auVar9._10_2_;
  auVar6._12_2_ = auVar5._12_2_ - auVar9._12_2_;
  auVar6._0_12_ = auVar3;
  auVar6._14_2_ = auVar5._14_2_ - auVar9._14_2_;
  auVar9._4_4_ = auVar6._12_4_;
  auVar9._0_4_ = auVar3._8_4_;
  auVar9._8_4_ = uVar2;
  auVar9._12_4_ = (int)((ulong)auVar3._0_8_ >> 0x20);
  auVar5 = psraw(auVar1,1);
  *(undefined1 (*) [16])out = auVar5;
  auVar5 = psraw(auVar9,1);
  *(undefined1 (*) [16])(out + 8) = auVar5;
  return;
}

Assistant:

static void FTransformWHT_SSE2(const int16_t* in, int16_t* out) {
  // Input is 12b signed.
  __m128i row0, row1, row2, row3;
  // Rows are 14b signed.
  FTransformWHTRow_SSE2(in + 0 * 64, &row0);
  FTransformWHTRow_SSE2(in + 1 * 64, &row1);
  FTransformWHTRow_SSE2(in + 2 * 64, &row2);
  FTransformWHTRow_SSE2(in + 3 * 64, &row3);

  {
    // The a* are 15b signed.
    const __m128i a0 = _mm_add_epi32(row0, row2);
    const __m128i a1 = _mm_add_epi32(row1, row3);
    const __m128i a2 = _mm_sub_epi32(row1, row3);
    const __m128i a3 = _mm_sub_epi32(row0, row2);
    const __m128i a0a3 = _mm_packs_epi32(a0, a3);
    const __m128i a1a2 = _mm_packs_epi32(a1, a2);

    // The b* are 16b signed.
    const __m128i b0b1 = _mm_add_epi16(a0a3, a1a2);
    const __m128i b3b2 = _mm_sub_epi16(a0a3, a1a2);
    const __m128i tmp_b2b3 = _mm_unpackhi_epi64(b3b2, b3b2);
    const __m128i b2b3 = _mm_unpacklo_epi64(tmp_b2b3, b3b2);

    _mm_storeu_si128((__m128i*)&out[0], _mm_srai_epi16(b0b1, 1));
    _mm_storeu_si128((__m128i*)&out[8], _mm_srai_epi16(b2b3, 1));
  }
}